

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdSplit.cpp
# Opt level: O2

int CmdSplit(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  int *piVar1;
  bool verbose;
  bool bVar2;
  iterator __begin3;
  time_t tVar3;
  ostream *poVar4;
  pointer pIVar5;
  _Base_ptr p_Var6;
  string *__return_storage_ptr__;
  string *this;
  iterator __end3;
  Datetime midpoint;
  vector<Interval,_std::allocator<Interval>_> intervals;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_230;
  Interval first;
  IntervalFilterAllWithIds filtering;
  Interval second;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first,"verbose",(allocator<char> *)&second);
  verbose = Rules::getBoolean(rules,(string *)&first,false);
  std::__cxx11::string::~string((string *)&first);
  CLI::getIds(&ids,cli);
  if (ids._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (this,"IDs must be specified. See \'timew help split\'.",(allocator<char> *)&first);
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(journal);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_230,&ids._M_t);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            (&filtering,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_230);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_230);
  getTracked(&intervals,database,rules,&filtering.super_IntervalFilter);
  if (((long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
            super__Vector_impl_data._M_start) / 0xc0 !=
      ids._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    for (p_Var6 = ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pIVar5 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (_Rb_tree_header *)p_Var6 != &ids._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      do {
        if (pIVar5 == intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&first,"ID \'@{1}\' does not correspond to any tracking.",
                     (allocator<char> *)&second);
          format<int>(__return_storage_ptr__,(string *)&first,p_Var6[1]._M_color);
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        piVar1 = &pIVar5->id;
        pIVar5 = pIVar5 + 1;
      } while (*piVar1 != p_Var6[1]._M_color);
    }
  }
  for (pIVar5 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar5 != intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                super__Vector_impl_data._M_finish; pIVar5 = pIVar5 + 1) {
    Interval::Interval(&first,pIVar5);
    Interval::Interval(&second,&first);
    bVar2 = Range::is_open(&first.super_Range);
    if (bVar2) {
      Datetime::Datetime(&midpoint);
      tVar3 = Datetime::operator-(&midpoint,&first.super_Range.start);
      Datetime::operator-=(&midpoint,tVar3 / 2);
    }
    else {
      midpoint._utc = first.super_Range.start._utc;
      midpoint._33_7_ = first.super_Range.start._33_7_;
      midpoint._date = first.super_Range.start._date;
      midpoint._julian = first.super_Range.start._julian;
      midpoint._day = first.super_Range.start._day;
      midpoint._seconds = first.super_Range.start._seconds;
      midpoint._offset = first.super_Range.start._offset;
      midpoint._year = first.super_Range.start._year;
      midpoint._month = first.super_Range.start._month;
      midpoint._week = first.super_Range.start._week;
      midpoint._weekday = first.super_Range.start._weekday;
      tVar3 = Datetime::operator-(&first.super_Range.end,&first.super_Range.start);
      Datetime::operator+=(&midpoint,tVar3 / 2);
    }
    first.super_Range.end._0_8_ = midpoint._0_8_;
    first.super_Range.end._8_8_ = midpoint._8_8_;
    first.super_Range.end._16_8_ = midpoint._16_8_;
    first.super_Range.end._24_8_ = midpoint._24_8_;
    first.super_Range.end._32_8_ = midpoint._32_8_;
    first.super_Range.end._date = midpoint._date;
    second.super_Range.start._year = midpoint._year;
    second.super_Range.start._month = midpoint._month;
    second.super_Range.start._week = midpoint._week;
    second.super_Range.start._weekday = midpoint._weekday;
    second.super_Range.start._julian = midpoint._julian;
    second.super_Range.start._day = midpoint._day;
    second.super_Range.start._seconds = midpoint._seconds;
    second.super_Range.start._offset = midpoint._offset;
    second.super_Range.start._32_4_ = midpoint._32_4_;
    second.super_Range.start._36_4_ = midpoint._36_4_;
    second.super_Range.start._date._0_4_ = (undefined4)midpoint._date;
    second.super_Range.start._date._4_4_ = midpoint._date._4_4_;
    Database::deleteInterval(database,pIVar5);
    validate(cli,rules,database,&first);
    Database::addInterval(database,&first,verbose);
    validate(cli,rules,database,&second);
    Database::addInterval(database,&second,verbose);
    if (verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Split @");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pIVar5->id);
      std::operator<<(poVar4,'\n');
    }
    Interval::~Interval(&second);
    Interval::~Interval(&first);
  }
  Journal::endTransaction(journal);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&intervals);
  IntervalFilterAllWithIds::~IntervalFilterAllWithIds(&filtering);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&ids._M_t);
  return 0;
}

Assistant:

int CmdSplit (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  std::set <int> ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help split'.");
  }

  journal.startTransaction ();

  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  for (const auto& interval : intervals)
  {
    Interval first = interval;
    Interval second = first;

    if (first.is_open ())
    {
      Datetime midpoint;
      midpoint -= (midpoint - first.start) / 2;
      first.end = midpoint;
      second.start = midpoint;
    }
    else
    {
      Datetime midpoint = first.start;
      midpoint += (first.end - first.start) / 2;
      first.end = midpoint;
      second.start = midpoint;
    }

    database.deleteInterval (interval);

    validate (cli, rules, database, first);
    database.addInterval (first, verbose);

    validate (cli, rules, database, second);
    database.addInterval (second, verbose);

    if (verbose)
    {
      std::cout << "Split @" << interval.id << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}